

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O3

plutovg_font_face_t *
plutovg_font_face_load_from_data
          (void *data,uint length,int ttcindex,plutovg_destroy_func_t destroy_func,void *closure)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  stbtt__buf cff;
  stbtt__buf fontdict;
  undefined8 uVar4;
  ushort uVar5;
  uint uVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  stbtt_uint32 sVar11;
  stbtt_uint32 sVar12;
  stbtt_uint32 sVar13;
  stbtt_uint32 sVar14;
  stbtt_uint32 sVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  plutovg_font_face_t *ppVar19;
  long lVar20;
  ulong uVar21;
  stbtt_uint32 fontstart;
  int iVar22;
  stbtt__buf sVar23;
  stbtt__buf sVar24;
  stbtt__buf sVar25;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  undefined1 in_stack_ffffffffffffff08 [12];
  stbtt_uint32 local_d8;
  stbtt_uint32 local_d4;
  stbtt_uint32 sVar26;
  stbtt_uint32 sVar27;
  uchar *in_stack_ffffffffffffff38;
  undefined8 local_a8;
  uchar *local_a0;
  uchar *local_98;
  undefined8 local_90;
  undefined8 local_88;
  uchar *local_80;
  stbtt__buf local_78;
  uchar *local_68;
  undefined8 local_60;
  uchar *local_58;
  stbtt__buf local_50;
  stbtt__buf local_40;
  
  sVar25._8_8_ = local_a8;
  sVar25.data = local_a0;
  sVar24._8_8_ = local_60;
  sVar24.data = local_58;
  sVar23._8_8_ = local_88;
  sVar23.data = local_80;
  bVar1 = *data;
  if (bVar1 < 0x4f) {
    if (bVar1 == 0) {
      if (*(char *)((long)data + 1) != '\x01') goto LAB_00103995;
    }
    else if ((bVar1 != 0x31) || (*(char *)((long)data + 1) != '\0')) goto LAB_00103995;
    if ((*(char *)((long)data + 2) != '\0') || (*(char *)((long)data + 3) != '\0'))
    goto LAB_00103995;
LAB_001038b1:
    fontstart = -(uint)(ttcindex != 0);
  }
  else {
    if (bVar1 == 0x4f) {
      if (((*(char *)((long)data + 1) != 'T') || (*(char *)((long)data + 2) != 'T')) ||
         (*(char *)((long)data + 3) != 'O')) goto LAB_00103995;
      goto LAB_001038b1;
    }
    if (bVar1 != 0x74) goto LAB_00103995;
    cVar2 = *(char *)((long)data + 1);
    if (cVar2 == 'r') {
      if ((*(char *)((long)data + 2) != 'u') || (*(char *)((long)data + 3) != 'e'))
      goto LAB_00103995;
      goto LAB_001038b1;
    }
    if (cVar2 != 't') {
      if (((cVar2 != 'y') || (*(char *)((long)data + 2) != 'p')) ||
         (*(char *)((long)data + 3) != '1')) goto LAB_00103995;
      goto LAB_001038b1;
    }
    if ((*(char *)((long)data + 2) != 'c') || (*(char *)((long)data + 3) != 'f')) goto LAB_00103995;
    uVar6 = *(uint *)((long)data + 4);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    if (((uVar6 != 0x20000) && (uVar6 != 0x10000)) ||
       (uVar6 = *(uint *)((long)data + 8),
       (int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) <=
       ttcindex)) goto LAB_00103995;
    uVar6 = *(uint *)((long)data + (long)ttcindex * 4 + 0xc);
    fontstart = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  if (fontstart != 0xffffffff) {
    sVar7 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"cmap");
    sVar8 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"loca");
    sVar9 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"head");
    sVar10 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"glyf");
    sVar11 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"hhea");
    sVar12 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"hmtx");
    sVar13 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"kern");
    sVar14 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"GPOS");
    if ((sVar12 == 0 || sVar11 == 0) || (sVar9 == 0 || sVar7 == 0)) goto LAB_00103995;
    if (sVar10 == 0) {
      sVar27 = 2;
      sVar26 = 0;
      local_d4 = 0;
      local_d8 = 0;
      sVar15 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"CFF ");
      if (sVar15 == 0) goto LAB_00103995;
      local_98 = (uchar *)((long)data + (ulong)sVar15);
      local_90 = 0x2000000000000000;
      local_50.size = 0x20000000;
      local_50.cursor = (uint)*(byte *)((long)data + (ulong)sVar15 + 2);
      local_50.data = local_98;
      stbtt__cff_get_index(&local_50);
      sVar23 = stbtt__cff_get_index(&local_50);
      local_40 = stbtt__cff_index_get(sVar23,0);
      stbtt__cff_get_index(&local_50);
      sVar24 = stbtt__cff_get_index(&local_50);
      stbtt__dict_get_ints(&local_40,0x11,1,(stbtt_uint32 *)&stack0xffffffffffffff30);
      stbtt__dict_get_ints(&local_40,0x106,1,(stbtt_uint32 *)&stack0xffffffffffffff34);
      stbtt__dict_get_ints(&local_40,0x124,1,&local_d4);
      stbtt__dict_get_ints(&local_40,0x125,1,&local_d8);
      uVar4 = local_50._8_8_;
      cff.size = sVar9;
      cff.data = (uchar *)in_stack_ffffffffffffff08._0_8_;
      cff.cursor = in_stack_ffffffffffffff08._8_4_;
      fontdict.data._4_4_ = sVar27;
      fontdict.data._0_4_ = sVar26;
      fontdict._8_8_ = in_stack_ffffffffffffff38;
      sVar25 = stbtt__get_subrs(cff,fontdict);
      if (sVar26 == 0 || sVar27 != 2) goto LAB_00103995;
      if (local_d4 == 0) {
        local_78 = (stbtt__buf)ZEXT816(0);
        local_68 = (uchar *)0x0;
        in_stack_ffffffffffffff38 = (uchar *)0x0;
        iVar22 = SUB84(uVar4,4);
      }
      else {
        uVar21 = (ulong)local_d8;
        if (uVar21 == 0) goto LAB_00103995;
        if (((int)local_d4 < 0) || (SUB84(uVar4,4) < (int)local_d4)) goto LAB_00103e9e;
        local_50.cursor = local_d4;
        local_78 = stbtt__cff_get_index(&local_50);
        uVar6 = (uint)uVar21;
        local_68 = (uchar *)((ulong)(local_50.size - uVar6) << 0x20);
        in_stack_ffffffffffffff38 = local_50.data + uVar21;
        iVar22 = local_50.size;
        if ((int)(local_50.size - uVar6 | uVar6) < 0 || local_50.size < (int)uVar6) {
          local_68 = (uchar *)0x0;
          in_stack_ffffffffffffff38 = (uchar *)0x0;
        }
      }
      if (((int)sVar26 < 0) || (iVar22 < (int)sVar26)) {
LAB_00103e9e:
        __assert_fail("!(o > b->size || o < 0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                      ,0x47d,"void stbtt__buf_seek(stbtt__buf *, int)");
      }
      local_50.cursor = sVar26;
      sVar23 = stbtt__cff_get_index(&local_50);
    }
    else {
      if (sVar8 == 0) goto LAB_00103995;
      local_90 = 0;
      local_98 = (uchar *)0x0;
    }
    sVar15 = stbtt__find_table((stbtt_uint8 *)data,fontstart,"maxp");
    if (sVar15 == 0) {
      uVar6 = 0xffff;
    }
    else {
      uVar5 = *(ushort *)((long)data + (ulong)sVar15 + 4);
      uVar6 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
    }
    uVar5 = *(ushort *)((long)data + (ulong)sVar7 + 2);
    uVar5 = uVar5 << 8 | uVar5 >> 8;
    if (uVar5 != 0) {
      uVar16 = sVar7 + 4;
      uVar21 = (ulong)uVar5;
      iVar22 = 0;
      do {
        uVar17 = (ulong)uVar16;
        uVar5 = *(ushort *)((long)data + uVar17) << 8 | *(ushort *)((long)data + uVar17) >> 8;
        if ((uVar5 == 0) ||
           ((uVar5 == 3 &&
            ((uVar5 = *(ushort *)((long)data + uVar17 + 2), uVar5 = uVar5 << 8 | uVar5 >> 8,
             uVar5 == 10 || (uVar5 == 1)))))) {
          uVar3 = *(uint *)((long)data + uVar17 + 4);
          iVar22 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
                   + sVar7;
        }
        uVar16 = uVar16 + 8;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
      if (iVar22 != 0) {
        lVar18 = (long)(int)sVar9;
        uVar5 = *(ushort *)((long)data + lVar18 + 0x32);
        ppVar19 = (plutovg_font_face_t *)malloc(0x8d0);
        ppVar19->ref_count = 1;
        (ppVar19->info).data = (uchar *)data;
        (ppVar19->info).fontstart = fontstart;
        (ppVar19->info).numGlyphs = uVar6;
        (ppVar19->info).loca = sVar8;
        (ppVar19->info).head = sVar9;
        (ppVar19->info).glyf = sVar10;
        (ppVar19->info).hhea = sVar11;
        (ppVar19->info).hmtx = sVar12;
        (ppVar19->info).kern = sVar13;
        (ppVar19->info).gpos = sVar14;
        (ppVar19->info).svg = -1;
        (ppVar19->info).index_map = iVar22;
        (ppVar19->info).indexToLocFormat = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
        (ppVar19->info).cff.data = local_98;
        (ppVar19->info).cff.cursor = (undefined4)local_90;
        (ppVar19->info).cff.size = local_90._4_4_;
        (ppVar19->info).charstrings = sVar23;
        (ppVar19->info).gsubrs = sVar24;
        (ppVar19->info).subrs = sVar25;
        (ppVar19->info).fontdicts.data = local_78.data;
        (ppVar19->info).fontdicts.cursor = local_78.cursor;
        (ppVar19->info).fontdicts.size = local_78.size;
        (ppVar19->info).fdselect.data = in_stack_ffffffffffffff38;
        *(uchar **)&(ppVar19->info).fdselect.cursor = local_68;
        lVar20 = (long)(int)sVar11;
        ppVar19->ascent =
             (int)(short)((ushort)*(byte *)((long)data + lVar20 + 4) << 8) |
             (uint)*(byte *)((long)data + lVar20 + 5);
        ppVar19->descent =
             (int)(short)((ushort)*(byte *)((long)data + lVar20 + 6) << 8) |
             (uint)*(byte *)((long)data + lVar20 + 7);
        ppVar19->line_gap =
             (int)(short)((ushort)*(byte *)((long)data + lVar20 + 8) << 8) |
             (uint)*(byte *)((long)data + lVar20 + 9);
        ppVar19->x1 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x24) << 8) |
                      (uint)*(byte *)((long)data + lVar18 + 0x25);
        ppVar19->y1 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x26) << 8) |
                      (uint)*(byte *)((long)data + lVar18 + 0x27);
        ppVar19->x2 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x28) << 8) |
                      (uint)*(byte *)((long)data + lVar18 + 0x29);
        ppVar19->y2 = (int)(short)((ushort)*(byte *)((long)data + lVar18 + 0x2a) << 8) |
                      (uint)*(byte *)((long)data + lVar18 + 0x2b);
        memset(ppVar19->glyphs,0,0x800);
        ppVar19->destroy_func = destroy_func;
        ppVar19->closure = closure;
        return ppVar19;
      }
    }
  }
LAB_00103995:
  if (destroy_func != (plutovg_destroy_func_t)0x0) {
    (*destroy_func)(closure);
  }
  return (plutovg_font_face_t *)0x0;
}

Assistant:

plutovg_font_face_t* plutovg_font_face_load_from_data(const void* data, unsigned int length, int ttcindex, plutovg_destroy_func_t destroy_func, void* closure)
{
    stbtt_fontinfo info;
    int offset = stbtt_GetFontOffsetForIndex(data, ttcindex);
    if(offset == -1 || !stbtt_InitFont(&info, data, offset)) {
        if(destroy_func)
            destroy_func(closure);
        return NULL;
    }

    plutovg_font_face_t* face = malloc(sizeof(plutovg_font_face_t));
    face->ref_count = 1;
    face->info = info;
    stbtt_GetFontVMetrics(&face->info, &face->ascent, &face->descent, &face->line_gap);
    stbtt_GetFontBoundingBox(&face->info, &face->x1, &face->y1, &face->x2, &face->y2);
    memset(face->glyphs, 0, sizeof(face->glyphs));
    face->destroy_func = destroy_func;
    face->closure = closure;
    return face;
}